

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftEa<(moira::Core)0,(moira::Instr)70,(moira::Mode)7,2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  u32 uVar2;
  bool bVar3;
  
  addr = computeEA<(moira::Core)0,(moira::Mode)7,2,0ull>(this,opcode & 7);
  uVar1 = read<(moira::Core)0,(moira::AddrSpace)1,2,0ull>(this,addr);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = read<(moira::Core)0,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  this->readBuffer = (u16)uVar2;
  bVar3 = (bool)((byte)uVar1 & 1);
  (this->reg).sr.x = bVar3;
  (this->reg).sr.c = bVar3;
  (this->reg).sr.v = false;
  (this->reg).sr.n = (bool)((byte)(uVar1 >> 0x10) & 1);
  (this->reg).sr.z = (uVar1 & 0x1fffe) == 0;
  write<(moira::Core)0,(moira::AddrSpace)1,2,0ull>(this,addr,uVar1 >> 1 & 0xffff);
  (*this->_vptr_Moira[2])(this,0x10);
  return;
}

Assistant:

void
Moira::execShiftEa(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = _____________xxx(opcode);

    u32 ea, data;
    readOp<C, M, S, STD_AE_FRAME>(src, &ea, &data);

    looping<I>() ? noPrefetch<C>(4) : prefetch<C, POLL>();
    writeM<C, M, S>(ea, shift<C, I, S>(1, data));

    if constexpr (I == Instr::ROR || I == Instr::ROL) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12, 11,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12, 11,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 12,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 12,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 14,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16, 11,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20, 11,        0,  0,  0)

    } else if constexpr (I == Instr::ASL) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12, 10,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12, 10,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 11,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 11,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 13,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16, 10,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20, 10,        0,  0,  0)

    } else {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12,  9,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12,  9,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 10,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 10,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 12,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16,  9,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20,  9,        0,  0,  0)
    }

    FINALIZE
}